

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::ParseAttributes(XMLElement *this,char *p,int *curLineNumPtr)

{
  int lineNum;
  XMLDocument *this_00;
  bool bVar1;
  uchar *p_00;
  char *pcVar2;
  XMLAttribute *this_01;
  int attrLineNum;
  XMLAttribute *attrib;
  XMLAttribute *prevAttribute;
  char *start;
  int *curLineNumPtr_local;
  char *p_local;
  XMLElement *this_local;
  
  attrib = (XMLAttribute *)0x0;
  curLineNumPtr_local = (int *)p;
  while( true ) {
    if (curLineNumPtr_local == (int *)0x0) {
      return (char *)0x0;
    }
    p_00 = (uchar *)XMLUtil::SkipWhiteSpace((char *)curLineNumPtr_local,curLineNumPtr);
    if (*p_00 == '\0') {
      this_00 = (this->super_XMLNode)._document;
      pcVar2 = Name(this);
      XMLDocument::SetError
                (this_00,XML_ERROR_PARSING_ELEMENT,p,pcVar2,(this->super_XMLNode)._parseLineNum);
      return (char *)0x0;
    }
    bVar1 = XMLUtil::IsNameStartChar(*p_00);
    if (!bVar1) {
      if (*p_00 == '>') {
        return (char *)(p_00 + 1);
      }
      if ((*p_00 == '/') && (p_00[1] == '>')) {
        this->_closingType = CLOSED;
        return (char *)(p_00 + 2);
      }
      XMLDocument::SetError
                ((this->super_XMLNode)._document,XML_ERROR_PARSING_ELEMENT,p,(char *)p_00,
                 (this->super_XMLNode)._parseLineNum);
      return (char *)0x0;
    }
    this_01 = CreateAttribute(this);
    this_01->_parseLineNum = ((this->super_XMLNode)._document)->_parseCurLineNum;
    lineNum = this_01->_parseLineNum;
    bVar1 = XMLDocument::ProcessEntities((this->super_XMLNode)._document);
    curLineNumPtr_local = (int *)XMLAttribute::ParseDeep(this_01,(char *)p_00,bVar1,curLineNumPtr);
    if (curLineNumPtr_local == (int *)0x0) break;
    pcVar2 = XMLAttribute::Name(this_01);
    pcVar2 = Attribute(this,pcVar2,(char *)0x0);
    if (pcVar2 != (char *)0x0) break;
    if (attrib == (XMLAttribute *)0x0) {
      this->_rootAttribute = this_01;
      attrib = this_01;
    }
    else {
      attrib->_next = this_01;
      attrib = this_01;
    }
  }
  DeleteAttribute(this_01);
  XMLDocument::SetError
            ((this->super_XMLNode)._document,XML_ERROR_PARSING_ATTRIBUTE,p,
             (char *)curLineNumPtr_local,lineNum);
  return (char *)0x0;
}

Assistant:

char* XMLElement::ParseAttributes( char* p, int* curLineNumPtr )
{
    const char* start = p;
    XMLAttribute* prevAttribute = 0;

    // Read the attributes.
    while( p ) {
        p = XMLUtil::SkipWhiteSpace( p, curLineNumPtr );
        if ( !(*p) ) {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, Name(), _parseLineNum );
            return 0;
        }

        // attribute.
        if (XMLUtil::IsNameStartChar( *p ) ) {
            XMLAttribute* attrib = CreateAttribute();
            TIXMLASSERT( attrib );
            attrib->_parseLineNum = _document->_parseCurLineNum;

            int attrLineNum = attrib->_parseLineNum;

            p = attrib->ParseDeep( p, _document->ProcessEntities(), curLineNumPtr );
            if ( !p || Attribute( attrib->Name() ) ) {
                DeleteAttribute( attrib );
                _document->SetError( XML_ERROR_PARSING_ATTRIBUTE, start, p, attrLineNum );
                return 0;
            }
            // There is a minor bug here: if the attribute in the source xml
            // document is duplicated, it will not be detected and the
            // attribute will be doubly added. However, tracking the 'prevAttribute'
            // avoids re-scanning the attribute list. Preferring performance for
            // now, may reconsider in the future.
            if ( prevAttribute ) {
                TIXMLASSERT( prevAttribute->_next == 0 );
                prevAttribute->_next = attrib;
            }
            else {
                TIXMLASSERT( _rootAttribute == 0 );
                _rootAttribute = attrib;
            }
            prevAttribute = attrib;
        }
        // end of the tag
        else if ( *p == '>' ) {
            ++p;
            break;
        }
        // end of the tag
        else if ( *p == '/' && *(p+1) == '>' ) {
            _closingType = CLOSED;
            return p+2;	// done; sealed element.
        }
        else {
            _document->SetError( XML_ERROR_PARSING_ELEMENT, start, p, _parseLineNum );
            return 0;
        }
    }
    return p;
}